

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_begin_message(mg_session *session,mg_message_begin **message)

{
  mg_map *map;
  undefined8 *in_RSI;
  mg_map **in_RDI;
  mg_message_begin *tmessage;
  mg_map *extra;
  int status;
  mg_allocator *in_stack_ffffffffffffffc8;
  mg_allocator *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined4 local_1c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_1c = mg_session_read_map((mg_session *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI);
  if (local_1c == 0) {
    map = (mg_map *)mg_allocator_malloc(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8)
    ;
    if (map == (mg_map *)0x0) {
      local_1c = -3;
    }
    else {
      map->size = (undefined4)local_28;
      map->capacity = local_28._4_4_;
      *in_RSI = map;
    }
    mg_map_destroy_ca(map,in_stack_ffffffffffffffc8);
  }
  return local_1c;
}

Assistant:

int mg_session_read_begin_message(mg_session *session,
                                  mg_message_begin **message) {
  int status = 0;

  mg_map *extra;
  status = mg_session_read_map(session, &extra);
  if (status != 0) {
    return status;
  }

  mg_message_begin *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_begin));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->extra = extra;
  *message = tmessage;

cleanup:
  mg_map_destroy_ca(extra, session->decoder_allocator);
  return status;
}